

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall CommandDrawSelectedInventory::Tick(CommandDrawSelectedInventory *this)

{
  byte in_CL;
  DSBarInfo *in_RDX;
  SBarInfoMainBlock *in_RSI;
  
  Tick((CommandDrawSelectedInventory *)
       &this[-1].super_CommandDrawNumber.super_CommandDrawString.shadowY,in_RSI,in_RDX,
       (bool)(in_CL & 1));
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			SBarInfoCommandFlowControl::Tick(block, statusBar, hudChanged);

			if(artiflashTick > 0)
				artiflashTick--;
			if(itemflashFade > 0)
			{
				itemflashFade -= 1./14;
				if(itemflashFade < 0)
					itemflashFade = 0;
			}

			SetTruth(statusBar->CPlayer->mo->InvSel == NULL || (level.flags & LEVEL_NOINVENTORYBAR), block, statusBar);

			CommandDrawImage::Tick(block, statusBar, hudChanged);
			CommandDrawNumber::Tick(block, statusBar, hudChanged);
		}